

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.cc
# Opt level: O2

void __thiscall
tchecker::parsing::system::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,stack_symbol_type *that)

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  long lVar6;
  value_type *this_00;
  
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.state =
       (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.
       state;
  *(undefined8 *)
   &(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   8) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x10) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x18) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x30) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x20) = 0;
  *(undefined8 *)
   ((long)&(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.field_0 +
   0x28) = 0;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value.yytypeid_ =
       (type_info *)0x0;
  pfVar1 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.
           filename;
  cVar4 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.
          line;
  cVar5 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.
          column;
  cVar2 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.
          line;
  cVar3 = (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.
          column;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.filename =
       (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.
       filename;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.line =
       cVar2;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.end.column =
       cVar3;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.filename
       = pfVar1;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.line =
       cVar4;
  (this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).location.begin.column =
       cVar5;
  lVar6 = (long)(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                super_by_state.state;
  if ((lVar6 != 0) && ((byte)yystos_[lVar6] - 0xc < 0x19)) {
    this_00 = &(this->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).value;
    switch((uint)(byte)yystos_[lVar6]) {
    case 0xc:
    case 0xe:
    case 0x13:
    case 0x1d:
      value_type::move<std::__cxx11::string>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x1a:
    case 0x1b:
      value_type::move<tchecker::parsing::attributes_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x1c:
      value_type::move<std::shared_ptr<tchecker::parsing::attr_t>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x1e:
      value_type::
      move<std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>,std::allocator<std::shared_ptr<tchecker::parsing::sync_constraint_t>>>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x1f:
      value_type::move<std::shared_ptr<tchecker::parsing::sync_constraint_t>>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x20:
      value_type::move<tchecker::sync_strength_t>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x23:
      value_type::move<int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
      break;
    case 0x24:
      value_type::move<unsigned_int>
                (this_00,&(that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).
                          value);
    }
  }
  (that->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>).super_by_state.state =
       '\0';
  return;
}

Assistant:

parser_t::stack_symbol_type::stack_symbol_type (YY_RVREF (stack_symbol_type) that)
    : super_type (YY_MOVE (that.state), YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_sync_strength: // sync_strength
        value.YY_MOVE_OR_COPY< enum tchecker::sync_strength_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_attr: // attr
        value.YY_MOVE_OR_COPY< std::shared_ptr<tchecker::parsing::attr_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sync_constraint: // sync_constraint
        value.YY_MOVE_OR_COPY< std::shared_ptr<tchecker::parsing::sync_constraint_t> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_TOK_ID: // "identifier"
      case symbol_kind::S_TOK_INTEGER: // "integer value"
      case symbol_kind::S_TOK_TEXT: // "text value"
      case symbol_kind::S_text_or_empty: // text_or_empty
        value.YY_MOVE_OR_COPY< std::string > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_sync_constraint_list: // sync_constraint_list
        value.YY_MOVE_OR_COPY< std::vector<std::shared_ptr<tchecker::parsing::sync_constraint_t>> > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_integer: // integer
        value.YY_MOVE_OR_COPY< tchecker::integer_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_attr_list: // attr_list
      case symbol_kind::S_non_empty_attr_list: // non_empty_attr_list
        value.YY_MOVE_OR_COPY< tchecker::parsing::attributes_t > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_uinteger: // uinteger
        value.YY_MOVE_OR_COPY< unsigned int > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

#if 201103L <= YY_CPLUSPLUS
    // that is emptied.
    that.state = empty_state;
#endif
  }